

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O2

void * FilterRender::doAuto(void *data,uint width,uint height)

{
  int iVar1;
  undefined8 *puVar2;
  uchar *a;
  ulong uVar3;
  bool bVar4;
  int i_1;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  int j_4;
  int i;
  ulong uVar13;
  int j;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int k_2;
  long lVar17;
  ulong uVar18;
  int j_3;
  int iVar19;
  int j_5;
  
  uVar3 = (ulong)width;
  uVar14 = (ulong)height;
  pvVar7 = operator_new__(uVar14 * 8);
  pvVar8 = operator_new__(uVar14 * 4);
  pvVar9 = operator_new__(uVar14 * 4);
  pvVar10 = operator_new__(uVar14);
  for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
    pvVar11 = operator_new__(uVar3 * 8);
    *(void **)((long)pvVar7 + uVar13 * 8) = pvVar11;
    for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
      pvVar12 = operator_new__(4);
      *(void **)((long)pvVar11 + uVar15 * 8) = pvVar12;
    }
  }
  pvVar11 = data;
  for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
    for (uVar15 = 0; uVar15 != uVar3; uVar15 = uVar15 + 1) {
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)pvVar7 + uVar13 * 8) + uVar15 * 8) + lVar16) =
             *(undefined1 *)((long)pvVar11 + lVar16);
      }
      pvVar11 = (void *)((long)pvVar11 + 4);
    }
  }
  uVar13 = 0;
  do {
    if (uVar13 == uVar14) {
      for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
        *(bool *)((long)pvVar10 + uVar13) =
             *(int *)((long)pvVar9 + uVar13 * 4) <= *(int *)((long)pvVar8 + uVar13 * 4);
      }
      uVar6 = 0;
      do {
        if (height <= uVar6) {
          uVar6 = 0;
          do {
            if (height <= uVar6) {
              for (uVar13 = 0;
                  (uVar15 = uVar14, uVar14 != uVar13 &&
                  (*(char *)((long)pvVar10 + uVar13) == '\x01')); uVar13 = uVar13 + 1) {
                *(undefined4 *)((long)pvVar9 + uVar13 * 4) = 0;
                *(uint *)((long)pvVar8 + uVar13 * 4) = width;
                *(undefined1 *)((long)pvVar10 + uVar13) = 0;
              }
              while( true ) {
                uVar6 = (uint)(uVar15 - 1);
                if (((int)uVar6 < 0) ||
                   (uVar13 = (ulong)(uVar6 & 0x7fffffff),
                   *(char *)((long)pvVar10 + uVar13) != '\x01')) break;
                *(undefined4 *)((long)pvVar9 + uVar13 * 4) = 0;
                *(uint *)((long)pvVar8 + uVar13 * 4) = width;
                *(undefined1 *)((long)pvVar10 + uVar13) = 0;
                uVar15 = uVar15 - 1;
              }
              for (uVar13 = 1; uVar13 < uVar14; uVar13 = uVar13 + 1) {
                if (*(char *)((long)pvVar10 + uVar13) == '\x01') {
                  *(undefined4 *)((long)pvVar8 + uVar13 * 4) =
                       *(undefined4 *)((long)pvVar8 + uVar13 * 4 + -4);
                  *(undefined4 *)((long)pvVar9 + uVar13 * 4) =
                       *(undefined4 *)((long)pvVar9 + uVar13 * 4 + -4);
                }
              }
              for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
                iVar19 = *(int *)((long)pvVar8 + uVar13 * 4);
                for (lVar16 = 0; lVar16 < iVar19; lVar16 = lVar16 + 1) {
                  for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
                    *(undefined1 *)
                     (*(long *)(*(long *)((long)pvVar7 + uVar13 * 8) + lVar16 * 8) + lVar17) = 0xff;
                  }
                }
                iVar19 = *(int *)((long)pvVar9 + uVar13 * 4);
                uVar15 = uVar3;
                while( true ) {
                  uVar6 = (int)uVar15 - 1;
                  uVar15 = (ulong)uVar6;
                  if ((int)uVar6 < iVar19) break;
                  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                    *(undefined1 *)
                     (*(long *)(*(long *)((long)pvVar7 + uVar13 * 8) + (long)(int)uVar6 * 8) +
                     lVar16) = 0;
                  }
                }
              }
              for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
                for (uVar15 = 0; uVar15 != uVar3; uVar15 = uVar15 + 1) {
                  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                    *(undefined1 *)((long)data + lVar16) =
                         *(undefined1 *)
                          (*(long *)(*(long *)((long)pvVar7 + uVar13 * 8) + uVar15 * 8) + lVar16);
                  }
                  data = (void *)((long)data + 4);
                }
              }
              operator_delete__(pvVar8);
            }
            lVar16 = (long)(int)uVar6;
            iVar19 = *(int *)((long)pvVar9 + lVar16 * 4);
            for (lVar17 = 0; uVar5 = height, uVar6 + (int)lVar17 < height; lVar17 = lVar17 + 1) {
              if (*(char *)((long)pvVar10 + lVar17 + lVar16) != '\0') {
                uVar5 = uVar6 + (int)lVar17;
                break;
              }
              iVar1 = *(int *)((long)pvVar9 + lVar17 * 4 + lVar16 * 4);
              if (iVar19 < iVar1) {
                iVar19 = iVar1;
              }
            }
            for (; lVar16 < (int)uVar5; lVar16 = lVar16 + 1) {
              if (*(char *)((long)pvVar10 + lVar16) == '\0') {
                *(int *)((long)pvVar9 + lVar16 * 4) = iVar19;
              }
            }
            uVar6 = uVar5 + 1;
          } while( true );
        }
        lVar16 = (long)(int)uVar6;
        iVar19 = *(int *)((long)pvVar8 + lVar16 * 4);
        for (lVar17 = 0; uVar5 = height, uVar6 + (int)lVar17 < height; lVar17 = lVar17 + 1) {
          if (*(char *)((long)pvVar10 + lVar17 + lVar16) != '\0') {
            uVar5 = uVar6 + (int)lVar17;
            break;
          }
          iVar1 = *(int *)((long)pvVar8 + lVar17 * 4 + lVar16 * 4);
          if (iVar1 < iVar19) {
            iVar19 = iVar1;
          }
        }
        for (; lVar16 < (int)uVar5; lVar16 = lVar16 + 1) {
          if (*(char *)((long)pvVar10 + lVar16) == '\0') {
            *(int *)((long)pvVar8 + lVar16 * 4) = iVar19;
          }
        }
        uVar6 = uVar5 + 1;
      } while( true );
    }
    *(undefined4 *)((long)pvVar8 + uVar13 * 4) = 0;
    *(uint *)((long)pvVar9 + uVar13 * 4) = width;
    puVar2 = *(undefined8 **)((long)pvVar7 + uVar13 * 8);
    a = (uchar *)*puVar2;
    uVar18 = 0;
    for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
      bVar4 = equal(a,(uchar *)puVar2[uVar15]);
      if (!bVar4) goto LAB_00105f41;
      *(int *)((long)pvVar8 + uVar13 * 4) = (int)uVar15;
      uVar18 = uVar15 & 0xffffffff;
    }
    uVar15 = 0;
    while ((iVar19 = width - 6, width - 5 != uVar15 &&
           (bVar4 = equal((uchar *)puVar2[uVar15],(uchar *)puVar2[uVar15 + 5]), bVar4))) {
      *(int *)((long)pvVar8 + uVar13 * 4) = (int)uVar15;
      uVar18 = uVar15 & 0xffffffff;
      uVar15 = uVar15 + 1;
    }
    while ((iVar1 = iVar19 + 5, (int)uVar18 <= iVar1 &&
           (bVar4 = equal((uchar *)puVar2[iVar1],(uchar *)puVar2[iVar19]), bVar4))) {
      *(int *)((long)pvVar9 + uVar13 * 4) = iVar1;
      iVar19 = iVar19 + -1;
    }
LAB_00105f41:
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void* FilterRender::doAuto(void *data, uint width, uint height) {
	unsigned char ***map;
	int *le;
	int *ri;
	bool *all;

	map = new unsigned char**[height];
	le = new int[height];
	ri = new int[height];
	all = new bool[height];

	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	const int margin = 5;

	for (int i = 0; i < height; i++) {
		bool flag = true;
		le[i] = 0;
		ri[i] = width;
		for (int j = 0; j < margin; j++) {
			if (equal(map[i][0], map[i][j])) {
				le[i] = j;
			} else {
				flag = false;
				break;
			}
		}
		if (!flag) continue;
		for (int j = 0; j < width - margin; j++) {
			if (equal(map[i][j], map[i][j + margin])) {
				le[i] = j;
			} else {
				break;
			}
		}
		for (int j = width - 1; j >= le[i]; j--) {
			if (equal(map[i][j], map[i][j - margin])) {
				ri[i] = j;
			} else {
				break;
			}
		}
	}

	for (int i = 0; i < height; i++) {
		if (le[i] >= ri[i]) {
			all[i] = true;
		} else {
			all[i] = false;
		}
	}

	int i, j;
	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = le[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (le[j] < common) {
				common = le[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			le[k] = common;
		}
	}

	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = ri[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (ri[j] > common) {
				common = ri[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			ri[k] = common;
		}
	}

	for (int i = 0; i < height; i++) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;

	}

	for (int i = height - 1; i >= 0; i--) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;
	}

	for (int i = 1; i < height; i++) {
		if (all[i]) {
			le[i] = le[i - 1];
			ri[i] = ri[i - 1];
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < le[i]; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 255;
			}
		}
		for (int j = width - 1; j >= ri[i]; j--) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 0;
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	delete [] le;
	delete [] ri;
	delete [] all;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}